

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool handleArgument(int *argc,char **argv)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  bool *pbVar4;
  int iVar5;
  string *psVar6;
  char *pcVar7;
  
  iVar1 = *argc;
  if (iVar1 < 2) {
    fwrite("Usage: ./steiner <input> [-out <.out>] [-plot <.plt>]\n",0x36,1,_stderr);
  }
  else {
    iVar2 = iVar1;
    for (iVar5 = 0; iVar5 < iVar2; iVar5 = iVar5 + 1) {
      pcVar7 = argv[iVar5];
      sVar3 = strlen(pcVar7);
      if (1 < sVar3) {
        pcVar7 = pcVar7 + 1;
        iVar2 = strcmp(pcVar7,"plot");
        pbVar4 = &gDoplot;
        psVar6 = &plotName_abi_cxx11_;
        if (iVar2 == 0) {
LAB_001065b4:
          *pbVar4 = true;
          iVar5 = iVar5 + 1;
          std::__cxx11::string::assign((char *)psVar6);
        }
        else {
          iVar2 = strcmp(pcVar7,"out");
          pbVar4 = &gOutfile;
          psVar6 = &outfileName_abi_cxx11_;
          if (iVar2 == 0) goto LAB_001065b4;
        }
        iVar2 = *argc;
      }
    }
  }
  return 1 < iVar1;
}

Assistant:

bool handleArgument(const int& argc, char** argv) {
  int i = 0;
  if (argc < 2) {
    fprintf(stderr, "Usage: ./steiner <input> [-out <.out>] [-plot <.plt>]\n");
    return false;
  }
  while(i < argc) {
    if (strlen(argv[i]) <= 1) {
      ++i;
      continue;
    }
    else if (strcmp(argv[i] + 1, "plot") == 0) {
      gDoplot = true;
      plotName = argv[++i];
    }
    else if (strcmp(argv[i] + 1, "out") == 0) {
      gOutfile = true;
      outfileName = argv[++i];
    }
    ++i;
  }
  return true;
}